

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

MSLConstexprSampler * __thiscall
spirv_cross::CompilerMSL::find_constexpr_sampler(CompilerMSL *this,uint32_t id)

{
  uint32_t uVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  MSLConstexprSampler *pMVar4;
  uint32_t id_local;
  key_type local_18;
  
  id_local = id;
  cVar2 = ::std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>,_std::_Select1st<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
          ::find(&(this->constexpr_samplers_by_id)._M_t,&id_local);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header) {
    uVar1 = Compiler::get_decoration((Compiler *)this,(ID)id_local,DecorationDescriptorSet);
    local_18.binding = Compiler::get_decoration((Compiler *)this,(ID)id_local,DecorationBinding);
    local_18.desc_set = uVar1;
    cVar3 = ::std::
            _Hashtable<spirv_cross::SetBindingPair,_std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->constexpr_samplers_by_binding)._M_h,&local_18);
    pMVar4 = (MSLConstexprSampler *)
             ((long)cVar3.
                    super__Node_iterator_base<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_true>
                    ._M_cur + 0x10);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>,_true>
        ._M_cur == (__node_type *)0x0) {
      pMVar4 = (MSLConstexprSampler *)0x0;
    }
  }
  else {
    pMVar4 = (MSLConstexprSampler *)&cVar2._M_node[1].field_0x4;
  }
  return pMVar4;
}

Assistant:

const MSLConstexprSampler *CompilerMSL::find_constexpr_sampler(uint32_t id) const
{
	// Try by ID.
	{
		auto itr = constexpr_samplers_by_id.find(id);
		if (itr != end(constexpr_samplers_by_id))
			return &itr->second;
	}

	// Try by binding.
	{
		uint32_t desc_set = get_decoration(id, DecorationDescriptorSet);
		uint32_t binding = get_decoration(id, DecorationBinding);

		auto itr = constexpr_samplers_by_binding.find({ desc_set, binding });
		if (itr != end(constexpr_samplers_by_binding))
			return &itr->second;
	}

	return nullptr;
}